

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void __thiscall
pybind11::detail::argument_loader<std::__cxx11::string,float>::
call<void,pybind11::detail::void_type,pybind11_init_pyhenson(pybind11::module_&)::__5&>
          (argument_loader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
           *this,type *f)

{
  undefined8 in_RSI;
  argument_loader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
  *in_RDI;
  undefined1 local_12 [18];
  
  call_impl<void,pybind11_init_pyhenson(pybind11::module_&)::__5&,0ul,1ul,pybind11::detail::void_type>
            (in_RDI,in_RSI,local_12);
  return;
}

Assistant:

enable_if_t<std::is_void<Return>::value, void_type> call(Func &&f) && {
        std::move(*this).template call_impl<remove_cv_t<Return>>(
            std::forward<Func>(f), indices{}, Guard{});
        return void_type();
    }